

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O1

token __thiscall
wigwag::detail::
listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
::create_node<std::function<void()>>
          (listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
           *this,handler_attributes attributes,function<void_()> *args)

{
  intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  *piVar1;
  function<void_()> *in_RCX;
  undefined4 in_register_00000034;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  self;
  handler_attributes local_14;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  local_10;
  
  local_10._raw =
       (listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
        *)CONCAT44(in_register_00000034,attributes);
  local_14 = (handler_attributes)args;
  LOCK();
  ((local_10._raw)->
  super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  ).super_atomic._counter.super___atomic_base<int>._M_i =
       ((local_10._raw)->
       super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
       ).super_atomic._counter.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (local_14 == none) {
    token::
    create<wigwag::detail::listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::handler_node,wigwag::detail::intrusive_ptr<wigwag::detail::listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>>&,std::function<void()>>
              ((token *)this,&local_10,in_RCX);
  }
  else {
    token::
    create<wigwag::detail::listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::handler_node_with_attributes,wigwag::handler_attributes&,wigwag::detail::intrusive_ptr<wigwag::detail::listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>>&,std::function<void()>>
              ((token *)this,&local_14,&local_10,in_RCX);
  }
  if (local_10._raw !=
      (listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
       *)0x0) {
    LOCK();
    piVar1 = &(local_10._raw)->
              super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
    ;
    (piVar1->super_atomic)._counter.super___atomic_base<int>._M_i =
         (piVar1->super_atomic)._counter.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((piVar1->super_atomic)._counter.super___atomic_base<int>._M_i == 0) {
      (*(local_10._raw)->_vptr_listenable_impl[1])();
    }
  }
  return (token)(implementation *)this;
}

Assistant:

token create_node(handler_attributes attributes, Args_&&... args)
        {
            add_ref();
            intrusive_ptr<listenable_impl> self(this);

            if (attributes == handler_attributes::none)
                return token::create<handler_node>(self, std::forward<Args_>(args)...);
            else
                return token::create<handler_node_with_attributes>(attributes, self, std::forward<Args_>(args)...);
        }